

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveVCProcess.cpp
# Opt level: O3

bool __thiscall Assimp::RemoveVCProcess::ProcessMesh(RemoveVCProcess *this,aiMesh *pMesh)

{
  aiBone *paVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uint real;
  int iVar8;
  aiBone **ppaVar9;
  uint i_1;
  uint uVar10;
  uint i;
  ulong uVar11;
  
  uVar10 = this->configDeleteFlags;
  if ((uVar10 >> 0xb & 1) != 0) {
    pMesh->mMaterialIndex = 0;
    uVar10 = this->configDeleteFlags;
  }
  if (((uVar10 & 2) == 0) || (pMesh->mNormals == (aiVector3D *)0x0)) {
    bVar2 = false;
  }
  else {
    operator_delete__(pMesh->mNormals);
    pMesh->mNormals = (aiVector3D *)0x0;
    uVar10 = this->configDeleteFlags;
    bVar2 = true;
  }
  if (((uVar10 & 4) != 0) && (pMesh->mTangents != (aiVector3D *)0x0)) {
    operator_delete__(pMesh->mTangents);
    pMesh->mTangents = (aiVector3D *)0x0;
    if (pMesh->mBitangents != (aiVector3D *)0x0) {
      operator_delete__(pMesh->mBitangents);
    }
    pMesh->mBitangents = (aiVector3D *)0x0;
    uVar10 = this->configDeleteFlags;
    bVar2 = true;
  }
  iVar8 = 0;
  uVar11 = 0;
  do {
    uVar3 = this->configDeleteFlags;
    if (pMesh->mTextureCoords[uVar11] == (aiVector3D *)0x0) goto LAB_0015ab5e;
    if ((uVar3 & 0x2000000 << ((byte)iVar8 & 0x1f)) == 0 && (uVar10 & 0x10) == 0) {
LAB_0015ab10:
      uVar11 = (ulong)((int)uVar11 + 1);
    }
    else {
      operator_delete__(pMesh->mTextureCoords[uVar11]);
      pMesh->mTextureCoords[uVar11] = (aiVector3D *)0x0;
      bVar2 = true;
      if ((uVar10 & 0x10) != 0) goto LAB_0015ab10;
      uVar3 = (int)uVar11 + 1;
      if (uVar3 < 8) {
        uVar6 = uVar11;
        lVar7 = (ulong)uVar3 + 0xe;
        do {
          pMesh->mTextureCoords[uVar6] = (aiVector3D *)pMesh->mColors[lVar7 + -6];
          uVar6 = (ulong)((int)uVar6 + 1);
          iVar4 = (int)lVar7;
          lVar7 = lVar7 + 1;
        } while (iVar4 != 0x15);
      }
      pMesh->mTextureCoords[7] = (aiVector3D *)0x0;
      bVar2 = true;
    }
    iVar8 = iVar8 + 1;
  } while (iVar8 != 8);
  uVar3 = this->configDeleteFlags;
LAB_0015ab5e:
  iVar8 = 0;
  uVar10 = 0;
  do {
    uVar5 = this->configDeleteFlags;
    if (pMesh->mColors[uVar10] == (aiColor4D *)0x0) goto LAB_0015abee;
    if ((uVar5 & 1 << ((char)uVar10 + 0x14U & 0x1f)) == 0 && (uVar3 & 8) == 0) {
LAB_0015aba7:
      uVar10 = uVar10 + 1;
    }
    else {
      operator_delete__(pMesh->mColors[uVar10]);
      pMesh->mColors[uVar10] = (aiColor4D *)0x0;
      bVar2 = true;
      if ((uVar3 & 8) != 0) goto LAB_0015aba7;
      if (uVar10 + 1 < 8) {
        lVar7 = (ulong)(uVar10 + 1) + 6;
        uVar5 = uVar10;
        do {
          pMesh->mColors[uVar5] = pMesh->mColors[lVar7 + -6];
          uVar5 = uVar5 + 1;
          iVar4 = (int)lVar7;
          lVar7 = lVar7 + 1;
        } while (iVar4 != 0xd);
      }
      pMesh->mColors[7] = (aiColor4D *)0x0;
      bVar2 = true;
    }
    iVar8 = iVar8 + 1;
  } while (iVar8 != 8);
  uVar5 = this->configDeleteFlags;
LAB_0015abee:
  if ((uVar5 & 0x20) == 0) {
    return bVar2;
  }
  ppaVar9 = pMesh->mBones;
  if (ppaVar9 == (aiBone **)0x0) {
    return bVar2;
  }
  if (pMesh->mNumBones != 0) {
    uVar11 = 0;
    do {
      paVar1 = pMesh->mBones[uVar11];
      if ((paVar1 != (aiBone *)0x0) && (paVar1->mWeights != (aiVertexWeight *)0x0)) {
        operator_delete__(paVar1->mWeights);
      }
      operator_delete(paVar1);
      uVar11 = uVar11 + 1;
    } while (uVar11 < pMesh->mNumBones);
    ppaVar9 = pMesh->mBones;
    if (ppaVar9 == (aiBone **)0x0) goto LAB_0015ac53;
  }
  operator_delete__(ppaVar9);
LAB_0015ac53:
  pMesh->mBones = (aiBone **)0x0;
  pMesh->mNumBones = 0;
  return true;
}

Assistant:

bool RemoveVCProcess::ProcessMesh(aiMesh* pMesh)
{
    bool ret = false;

    // if all materials have been deleted let the material
    // index of the mesh point to the created default material
    if ( configDeleteFlags & aiComponent_MATERIALS)
        pMesh->mMaterialIndex = 0;

    // handle normals
    if (configDeleteFlags & aiComponent_NORMALS && pMesh->mNormals)
    {
        delete[] pMesh->mNormals;
        pMesh->mNormals = NULL;
        ret = true;
    }

    // handle tangents and bitangents
    if (configDeleteFlags & aiComponent_TANGENTS_AND_BITANGENTS && pMesh->mTangents)
    {
        delete[] pMesh->mTangents;
        pMesh->mTangents = NULL;

        delete[] pMesh->mBitangents;
        pMesh->mBitangents = NULL;
        ret = true;
    }

    // handle texture coordinates
    bool b = (0 != (configDeleteFlags & aiComponent_TEXCOORDS));
    for (unsigned int i = 0, real = 0; real < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++real)
    {
        if (!pMesh->mTextureCoords[i])break;
        if (configDeleteFlags & aiComponent_TEXCOORDSn(real) || b)
        {
            delete [] pMesh->mTextureCoords[i];
            pMesh->mTextureCoords[i] = NULL;
            ret = true;

            if (!b)
            {
                // collapse the rest of the array
                for (unsigned int a = i+1; a < AI_MAX_NUMBER_OF_TEXTURECOORDS;++a)
                    pMesh->mTextureCoords[a-1] = pMesh->mTextureCoords[a];

                pMesh->mTextureCoords[AI_MAX_NUMBER_OF_TEXTURECOORDS-1] = NULL;
                continue;
            }
        }
        ++i;
    }

    // handle vertex colors
    b = (0 != (configDeleteFlags & aiComponent_COLORS));
    for (unsigned int i = 0, real = 0; real < AI_MAX_NUMBER_OF_COLOR_SETS; ++real)
    {
        if (!pMesh->mColors[i])break;
        if (configDeleteFlags & aiComponent_COLORSn(i) || b)
        {
            delete [] pMesh->mColors[i];
            pMesh->mColors[i] = NULL;
            ret = true;

            if (!b)
            {
                // collapse the rest of the array
                for (unsigned int a = i+1; a < AI_MAX_NUMBER_OF_COLOR_SETS;++a)
                    pMesh->mColors[a-1] = pMesh->mColors[a];

                pMesh->mColors[AI_MAX_NUMBER_OF_COLOR_SETS-1] = NULL;
                continue;
            }
        }
        ++i;
    }

    // handle bones
    if (configDeleteFlags & aiComponent_BONEWEIGHTS && pMesh->mBones)
    {
        ArrayDelete(pMesh->mBones,pMesh->mNumBones);
        ret = true;
    }
    return ret;
}